

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_options.c
# Opt level: O0

char * parse_option(char **s,char **m,char **o,char **v)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *p;
  char *val;
  char *opt;
  char *mod;
  char *end;
  char **v_local;
  char **o_local;
  char **m_local;
  char **s_local;
  
  mod = (char *)0x0;
  opt = (char *)0x0;
  pcVar3 = *s;
  p = "1";
  pcVar1 = strchr(pcVar3,0x2c);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    mod = pcVar1 + 1;
  }
  sVar2 = strlen(pcVar3);
  if (sVar2 == 0) {
    *s = mod;
    *m = (char *)0x0;
    *o = (char *)0x0;
    *v = (char *)0x0;
  }
  else {
    pcVar1 = strchr(pcVar3,0x3a);
    val = pcVar3;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      val = pcVar1 + 1;
      opt = pcVar3;
    }
    pcVar3 = strchr(val,0x3d);
    if (pcVar3 == (char *)0x0) {
      if (*val == '!') {
        val = val + 1;
        p = (char *)0x0;
      }
    }
    else {
      *pcVar3 = '\0';
      p = pcVar3 + 1;
    }
    *s = mod;
    *m = opt;
    *o = val;
    *v = p;
  }
  return mod;
}

Assistant:

static const char *
parse_option(const char **s, const char **m, const char **o, const char **v)
{
	const char *end, *mod, *opt, *val;
	char *p;

	end = NULL;
	mod = NULL;
	opt = *s;
	val = "1";

	p = strchr(opt, ',');

	if (p != NULL) {
		*p = '\0';
		end = ((const char *)p) + 1;
	}

	if (0 == strlen(opt)) {
		*s = end;
		*m = NULL;
		*o = NULL;
		*v = NULL;
		return end;
	}

	p = strchr(opt, ':');
	if (p != NULL) {
		*p = '\0';
		mod = opt;
		opt = ++p;
	}

	p = strchr(opt, '=');
	if (p != NULL) {
		*p = '\0';
		val = ++p;
	} else if (opt[0] == '!') {
		++opt;
		val = NULL;
	}

	*s = end;
	*m = mod;
	*o = opt;
	*v = val;

	return end;
}